

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O2

idx_t __thiscall
duckdb::DictionaryDecoder::GetValidValues
          (DictionaryDecoder *this,uint8_t *defines,idx_t read_count,idx_t result_offset)

{
  ColumnReader *pCVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  idx_t iVar4;
  idx_t valid_count;
  idx_t iVar5;
  idx_t iVar6;
  
  iVar5 = read_count;
  if (defines != (uint8_t *)0x0) {
    pCVar1 = this->reader;
    psVar2 = (this->valid_sel).sel_vector;
    iVar4 = this->dictionary_size;
    psVar3 = (this->dictionary_selection_vector).sel_vector;
    iVar5 = 0;
    for (iVar6 = 0; read_count != iVar6; iVar6 = iVar6 + 1) {
      psVar2[iVar5] = (sel_t)iVar6;
      psVar3[iVar6] = (sel_t)iVar4;
      iVar5 = iVar5 + (pCVar1->column_schema->max_define == (ulong)defines[iVar6 + result_offset]);
    }
  }
  return iVar5;
}

Assistant:

idx_t DictionaryDecoder::GetValidValues(uint8_t *defines, idx_t read_count, idx_t result_offset) {
	idx_t valid_count = read_count;
	if (defines) {
		D_ASSERT(can_have_nulls);
		valid_count = 0;
		for (idx_t i = 0; i < read_count; i++) {
			valid_sel.set_index(valid_count, i);
			dictionary_selection_vector.set_index(i, dictionary_size);
			valid_count += defines[result_offset + i] == reader.MaxDefine();
		}
	}
	return valid_count;
}